

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdynfunc.cpp
# Opt level: O0

CTcSymbol * __thiscall
CVmDynFuncSymtab::find_local(CVmDynFuncSymtab *this,textchar_t *sym,size_t len)

{
  int iVar1;
  int iVar2;
  CTcSymbol *pCVar3;
  long in_RDI;
  vm_obj_id_t unaff_retaddr;
  CTcSymbol *ret;
  vm_val_t ele;
  int i;
  int n;
  vm_val_t lt;
  int in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  int in_stack_ffffffffffffffc4;
  int iVar4;
  vm_val_t *in_stack_ffffffffffffffd0;
  CTcSymbol *local_8;
  
  if (*(int *)(in_RDI + 0x3c) == 0) {
    local_8 = (CTcSymbol *)0x0;
  }
  else {
    iVar1 = CVmObjFrameDesc::is_framedesc_obj(0);
    if (iVar1 == 0) {
      vm_val_t::set_obj((vm_val_t *)&stack0xffffffffffffffd0,*(vm_obj_id_t *)(in_RDI + 0x3c));
      iVar1 = vm_val_t::ll_length((vm_val_t *)
                                  CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
      for (iVar4 = 1; iVar4 <= iVar1; iVar4 = iVar4 + 1) {
        vm_val_t::ll_index(in_stack_ffffffffffffffd0,(vm_val_t *)CONCAT44(iVar1,iVar4),
                           in_stack_ffffffffffffffc4);
        if (((in_stack_ffffffffffffffb8 == 5) &&
            (iVar2 = CVmObjFrameDesc::is_framedesc_obj(0), iVar2 != 0)) &&
           (pCVar3 = find_local((CVmDynFuncSymtab *)ele.val.native_desc,(textchar_t *)ele._0_8_,
                                (size_t)ret,unaff_retaddr), pCVar3 != (CTcSymbol *)0x0)) {
          return pCVar3;
        }
      }
      local_8 = (CTcSymbol *)0x0;
    }
    else {
      local_8 = find_local((CVmDynFuncSymtab *)ele.val.native_desc,(textchar_t *)ele._0_8_,
                           (size_t)ret,unaff_retaddr);
    }
  }
  return local_8;
}

Assistant:

CTcSymbol *find_local(const textchar_t *sym, size_t len)
    {
        /* if there's no user-code table, there's nothing to search */
        if (locals_ == VM_INVALID_OBJ)
            return 0;

        /* establish access to globals */
        VMGLOB_PTR(gptr_);

        /* 
         *   if it's a StackFrameDesc object, look up the symbol; otherwise
         *   try to treat it as a list-like object, and check each element of
         *   the list 
         */
        if (CVmObjFrameDesc::is_framedesc_obj(vmg_ locals_))
        {
            /* look up the value in our single table */
            return find_local(sym, len, locals_);
        }
        else
        {
            /* assume it's a list - set up an object value */
            vm_val_t lt;
            lt.set_obj(locals_);
            
            /* check each list element */
            int n = lt.ll_length(vmg0_);
            for (int i = 1 ; i <= n ; ++i)
            {
                /* get this element */
                vm_val_t ele;
                lt.ll_index(vmg_ &ele, i);

                /* if it's a StackFrameDesc object, check it */
                if (ele.typ == VM_OBJ
                    && CVmObjFrameDesc::is_framedesc_obj(vmg_ ele.val.obj))
                {
                    /* look up the value in this table */
                    CTcSymbol *ret = find_local(sym, len, ele.val.obj);

                    /* if we found it, return the value */
                    if (ret != 0)
                        return ret;
                }
            }

            /* we didn't find a value */
            return 0;
        }